

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tccmdutl.cpp
# Opt level: O0

int CTcCommandUtil::parse_opt_file(osfildef *fp,char **argv,CTcOptFileHelper *helper)

{
  int iVar1;
  char *pcVar2;
  void *s2;
  size_t sVar3;
  char *pcVar4;
  undefined8 uVar5;
  long *in_RDX;
  long in_RSI;
  FILE *in_RDI;
  bool bVar6;
  char *dst;
  size_t arg_len;
  char *start_1;
  size_t copy_len;
  char *start;
  size_t new_buf_len;
  char *new_buf;
  char *p;
  size_t len;
  CTcOptFileHelperDefault default_helper;
  int argc;
  size_t buflen;
  char config_id [128];
  char *buf;
  undefined4 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef4;
  undefined1 in_stack_fffffffffffffef5;
  undefined1 in_stack_fffffffffffffef6;
  undefined1 in_stack_fffffffffffffef7;
  char *local_108;
  size_t local_100;
  char *local_f8;
  size_t local_f0;
  void *in_stack_ffffffffffffff40;
  int local_b4;
  size_t local_b0;
  char local_a8 [136];
  char *local_20;
  long *local_18;
  long local_10;
  FILE *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  CTcOptFileHelperDefault::CTcOptFileHelperDefault
            ((CTcOptFileHelperDefault *)
             CONCAT17(in_stack_fffffffffffffef7,
                      CONCAT16(in_stack_fffffffffffffef6,
                               CONCAT15(in_stack_fffffffffffffef5,
                                        CONCAT14(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0
                                                )))));
  if (local_18 == (long *)0x0) {
    local_18 = (long *)&stack0xffffffffffffff40;
  }
  local_b0 = 0x200;
  local_20 = (char *)(**(code **)*local_18)(local_18,0x200);
  local_a8[0] = '\0';
  local_b4 = 0;
LAB_0029c3a1:
  pcVar2 = fgets(local_20,(int)local_b0,local_8);
  if (pcVar2 == (char *)0x0) {
    (**(code **)(*local_18 + 8))(local_18,local_20);
    return local_b4;
  }
  do {
    s2 = (void *)strlen(local_20);
    pcVar2 = local_20;
    if ((s2 != (void *)0x0) &&
       ((local_20[(long)s2 - 1] == '\n' || (local_20[(long)s2 - 1] == '\r')))) goto LAB_0029c422;
    if (s2 != (void *)(local_b0 - 1)) break;
    sVar3 = local_b0 + 0x200;
    pcVar2 = (char *)(**(code **)*local_18)(local_18,sVar3);
    memcpy(pcVar2,local_20,local_b0);
    (**(code **)(*local_18 + 8))(local_18,local_20);
    local_20 = pcVar2;
    pcVar4 = fgets(pcVar2 + (long)s2,(int)sVar3 - (int)s2,local_8);
    pcVar2 = local_20;
    local_b0 = sVar3;
  } while (pcVar4 != (char *)0x0);
  goto LAB_0029c56f;
LAB_0029c422:
  while( true ) {
    bVar6 = false;
    if ((s2 != (void *)0x0) && (bVar6 = true, local_20[(long)s2 - 1] != '\n')) {
      bVar6 = local_20[(long)s2 - 1] == '\r';
    }
    if (!bVar6) break;
    s2 = (void *)((long)s2 - 1);
  }
  local_20[(long)s2] = '\0';
LAB_0029c56f:
  while (iVar1 = isspace((int)*pcVar2), iVar1 != 0) {
    pcVar2 = pcVar2 + 1;
  }
  sVar3 = strlen(pcVar2);
  if ((sVar3 < 9) || (iVar1 = memicmp(in_stack_ffffffffffffff40,s2,(size_t)pcVar2), iVar1 != 0)) {
    if (local_a8[0] == '\0') {
      if ((*pcVar2 == '\0') || (*pcVar2 == '#')) {
        (**(code **)(*local_18 + 0x10))(local_18,local_20);
      }
      else {
        (**(code **)(*local_18 + 0x18))(local_18,local_20);
        pcVar2 = local_20;
        while (local_f8 = pcVar2, *pcVar2 != '\0') {
          while (iVar1 = isspace((int)*local_f8), iVar1 != 0) {
            local_f8 = local_f8 + 1;
          }
          if (*local_f8 == '\0') break;
          pcVar2 = local_f8;
          if (*local_f8 == '\"') {
            local_f8 = local_f8 + 1;
            local_108 = local_f8;
            for (pcVar2 = local_f8; *pcVar2 != '\0'; pcVar2 = pcVar2 + 1) {
              if (*pcVar2 == '\"') {
                if (pcVar2[1] != '\"') {
                  pcVar2 = pcVar2 + 1;
                  break;
                }
                pcVar2 = pcVar2 + 1;
              }
              *local_108 = *pcVar2;
              local_108 = local_108 + 1;
            }
            local_100 = (long)local_108 - (long)local_f8;
          }
          else {
            while( true ) {
              bVar6 = false;
              if (*pcVar2 != '\0') {
                iVar1 = isspace((int)*pcVar2);
                bVar6 = iVar1 == 0;
              }
              if (!bVar6) break;
              pcVar2 = pcVar2 + 1;
            }
            local_100 = (long)pcVar2 - (long)local_f8;
          }
          if (local_10 != 0) {
            uVar5 = (**(code **)*local_18)(local_18,local_100 + 1);
            *(undefined8 *)(local_10 + (long)local_b4 * 8) = uVar5;
            memcpy(*(void **)(local_10 + (long)local_b4 * 8),local_f8,local_100);
            *(undefined1 *)(*(long *)(local_10 + (long)local_b4 * 8) + local_100) = 0;
          }
          local_b4 = local_b4 + 1;
        }
      }
    }
    else {
      (**(code **)(*local_18 + 0x20))(local_18,local_a8,local_20,0);
    }
  }
  else {
    pcVar2 = pcVar2 + 8;
    pcVar4 = pcVar2;
    while( true ) {
      bVar6 = false;
      if (*pcVar4 != ']') {
        bVar6 = *pcVar4 != '\0';
      }
      if (!bVar6) break;
      pcVar4 = pcVar4 + 1;
    }
    local_f0 = (long)pcVar4 - (long)pcVar2;
    if (0x7f < local_f0) {
      local_f0 = 0x7f;
    }
    memcpy(local_a8,pcVar2,local_f0);
    local_a8[local_f0] = '\0';
    (**(code **)(*local_18 + 0x20))(local_18,local_a8,local_20,1);
  }
  goto LAB_0029c3a1;
}

Assistant:

int CTcCommandUtil::parse_opt_file(osfildef *fp, char **argv,
                                   CTcOptFileHelper *helper)
{
    char *buf;
    char config_id[128];
    size_t buflen;
    int argc;
    CTcOptFileHelperDefault default_helper;

    /* if they didn't give us a helper object, use our default */
    if (helper == 0)
        helper = &default_helper;

    /* allocate our initial buffer */
    buflen = 512;
    buf = helper->alloc_opt_file_str(buflen);

    /* we're not in a configuration section yet */
    config_id[0] = '\0';

    /* keep going until we run out of text in the file */
    for (argc = 0 ; ; )
    {
        size_t len;
        char *p;

        /* read the next line - stop if we're done */
        if (osfgets(buf, buflen, fp) == 0)
            break;

        /* check for proper termination */
        for (;;)
        {
            /* get the buffer length */
            len = strlen(buf);

            /* check for a newline of some kind at the end */
            if (len != 0 && (buf[len - 1] == '\n' || buf[len - 1] == '\r'))
            {
                /* 
                 *   remove consecutive newline/return characters - in case
                 *   we are using a file moved from another system with
                 *   incompatible newline conventions, simply remove all of
                 *   the newlines we find 
                 */
                while (len != 0
                       && (buf[len-1] == '\n' || buf[len - 1] == '\r'))
                    --len;

                /* null-terminate the line */
                buf[len] = '\0';

                /* we now have our line */
                break;
            }
            else if (len == buflen - 1)
            {
                char *new_buf;
                size_t new_buf_len;
                
                /* 
                 *   The buffer was completely filled, and wasn't
                 *   null-terminated - the line must be too long for the
                 *   buffer.  Expand the buffer and go back for more.  
                 */
                new_buf_len = buflen + 512;
                new_buf = helper->alloc_opt_file_str(new_buf_len);

                /* copy the old buffer into the new buffer */
                memcpy(new_buf, buf, buflen);

                /* discard the old buffer */
                helper->free_opt_file_str(buf);

                /* switch to the new buffer */
                buf = new_buf;
                buflen = new_buf_len;

                /* append more data into the line buffer and try again */
                if (osfgets(buf + len, buflen - len, fp) == 0)
                    break;
            }
            else
            {
                /* 
                 *   The buffer wasn't completely full, and we didn't find a
                 *   newline.  This must mean that we've reached the end of
                 *   the file, so we've read as much as we can for this
                 *   line.  
                 */
                break;
            }
        }

        /* skip leading spaces */
        for (p = buf ; isspace(*p) ; ++p) ;

        /*
         *   Check to see if we're entering a new configuration section.  If
         *   the line matches the pattern "[Config:xxx]", then we're starting
         *   a new configuration section with identifier "xxx". 
         */
        if (strlen(p) > 8 && memicmp(p, "[config:", 8) == 0)
        {
            char *start;
            size_t copy_len;
            
            /* 
             *   note the part after the colon and up to the closing bracket
             *   - it's the ID of this configuration section 
             */
            for (p += 8, start = p ; *p != ']' && *p != '\0' ; ++p) ;

            /* limit the ID size to our buffer maximum */
            copy_len = p - start;
            if (copy_len > sizeof(config_id) - 1)
                copy_len = sizeof(config_id) - 1;

            /* copy and null-terminate the ID string */
            memcpy(config_id, start, copy_len);
            config_id[copy_len] = '\0';

            /* process the configuration ID line itself as a config line */
            helper->process_config_line(config_id, buf, TRUE);

            /* we're done processing this line */
            continue;
        }

        /* 
         *   if we're in a configuration section, simply process the line
         *   through the helper as a configuration line - this doesn't
         *   contain any options we can parse, since configuration sections
         *   are private to their respective definers 
         */
        if (config_id[0] != '\0')
        {
            /* process the configuration line through the helper */
            helper->process_config_line(config_id, buf, FALSE);

            /* we're done with this line */
            continue;
        }
        
        /* 
         *   If we've reached the end of the line or a command character
         *   ('#'), we're done with this line.  Note that we check for
         *   comments AFTER checking to see if we're in a config section,
         *   because we want to send any comment lines within a config
         *   section to the helper for processing as part of the config -
         *   even comments are opaque to us within a config section.  
         */
        if (*p == '\0' || *p == '#')
        {
            /* tell the helper about the comment */
            helper->process_comment_line(buf);

            /* we're done with the line - go back for the next one */
            continue;
        }

        /* tell the helper about the non-comment line */
        helper->process_non_comment_line(buf);

        /* parse the options on this line */
        for (p = buf ; *p != '\0' ; )
        {
            char *start;
            size_t arg_len;

            /* skip leading spaces */
            for ( ; isspace(*p) ; ++p) ;

            /* check to see if we reached the end of the line */
            if (*p == '\0')
                break;

            /* 
             *   if the argument is quoted, find the matching quote;
             *   otherwise, look for the next space 
             */
            if (*p == '"')
            {
                char *dst;

                /* find the matching quote */
                for (++p, start = dst = p ; *p != '\0' ; ++p)
                {
                    /* 
                     *   if this is a quote, check for stuttering - if it's
                     *   stuttered, treat it as a single quote (and convert
                     *   it to same), otherwise we've reached the end of the
                     *   argument 
                     */
                    if (*p == '"')
                    {
                        /* check for stuttering */
                        if (*(p+1) == '"')
                        {
                            /* 
                             *   it's stuttered - skip the extra quote, so
                             *   that we copy only a single quote 
                             */
                            ++p;
                        }
                        else
                        {
                            /* this is our closing quote - skip it */
                            ++p;

                            /* we're done with the argument */
                            break;
                        }
                    }

                    /* copy this character to the output */
                    *dst++ = *p;
                }

                /* note the length of the argument */
                arg_len = dst - start;
            }
            else
            {
                /* find the next space */
                for (start = p ; *p != '\0' && !isspace(*p) ; ++p) ;

                /* note the length of the argument */
                arg_len = p - start;
            }

            /* store the argument if we have an output vector */
            if (argv != 0)
            {
                /* allocate the argument */
                argv[argc] = helper->alloc_opt_file_str(arg_len + 1);

                /* copy it into the result */
                memcpy(argv[argc], start, arg_len);
                argv[argc][arg_len] = '\0';
            }

            /* count the argument */
            ++argc;
        }
    }

    /* done with our line buffer - delete it */
    helper->free_opt_file_str(buf);

    /* return the argument count */
    return argc;
}